

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_integer_attribute_decoder.cc
# Opt level: O0

void __thiscall
draco::SequentialIntegerAttributeDecoder::StoreTypedValues<int>
          (SequentialIntegerAttributeDecoder *this,uint32_t num_values)

{
  undefined1 auVar1 [16];
  byte bVar2;
  uint uVar3;
  PointAttribute *this_00;
  ulong uVar4;
  int32_t *piVar5;
  type piVar6;
  long byte_pos;
  uint in_ESI;
  SequentialAttributeDecoder *in_RDI;
  int value;
  int c;
  uint32_t i;
  int out_byte_pos;
  int val_id;
  int32_t *portable_attribute_data;
  unique_ptr<int[],_std::default_delete<int[]>_> att_val;
  int entry_size;
  int num_components;
  int *in_stack_ffffffffffffff88;
  DataBuffer *in_stack_ffffffffffffff90;
  SequentialIntegerAttributeDecoder *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int32_t in_stack_ffffffffffffffa4;
  int local_44;
  uint local_40;
  int local_3c;
  int local_38;
  
  this_00 = SequentialAttributeDecoder::attribute(in_RDI);
  bVar2 = GeometryAttribute::num_components(&this_00->super_GeometryAttribute);
  uVar3 = (uint)bVar2;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(int)uVar3;
  uVar4 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  operator_new__(uVar4);
  std::unique_ptr<int[],std::default_delete<int[]>>::
  unique_ptr<int*,std::default_delete<int[]>,void,bool>
            ((unique_ptr<int[],_std::default_delete<int[]>_> *)in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88);
  piVar5 = GetPortableAttributeData(in_stack_ffffffffffffff98);
  local_38 = 0;
  local_3c = 0;
  for (local_40 = 0; local_40 < in_ESI; local_40 = local_40 + 1) {
    for (local_44 = 0; local_44 < (int)uVar3; local_44 = local_44 + 1) {
      in_stack_ffffffffffffffa4 = piVar5[local_38];
      piVar6 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                         ((unique_ptr<int[],_std::default_delete<int[]>_> *)
                          in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88);
      *piVar6 = in_stack_ffffffffffffffa4;
      local_38 = local_38 + 1;
    }
    SequentialAttributeDecoder::attribute(in_RDI);
    in_stack_ffffffffffffff90 = PointAttribute::buffer((PointAttribute *)0x20b678);
    byte_pos = (long)local_3c;
    std::unique_ptr<int[],_std::default_delete<int[]>_>::get
              ((unique_ptr<int[],_std::default_delete<int[]>_> *)in_stack_ffffffffffffff90);
    DataBuffer::Write((DataBuffer *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      byte_pos,in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88);
    local_3c = uVar3 * 4 + local_3c;
  }
  std::unique_ptr<int[],_std::default_delete<int[]>_>::~unique_ptr
            ((unique_ptr<int[],_std::default_delete<int[]>_> *)in_stack_ffffffffffffff90);
  return;
}

Assistant:

void SequentialIntegerAttributeDecoder::StoreTypedValues(uint32_t num_values) {
  const int num_components = attribute()->num_components();
  const int entry_size = sizeof(AttributeTypeT) * num_components;
  const std::unique_ptr<AttributeTypeT[]> att_val(
      new AttributeTypeT[num_components]);
  const int32_t *const portable_attribute_data = GetPortableAttributeData();
  int val_id = 0;
  int out_byte_pos = 0;
  for (uint32_t i = 0; i < num_values; ++i) {
    for (int c = 0; c < num_components; ++c) {
      const AttributeTypeT value =
          static_cast<AttributeTypeT>(portable_attribute_data[val_id++]);
      att_val[c] = value;
    }
    // Store the integer value into the attribute buffer.
    attribute()->buffer()->Write(out_byte_pos, att_val.get(), entry_size);
    out_byte_pos += entry_size;
  }
}